

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Neighbor_allgather
              (void *sendbuf,int sendcount,MPIABI_Datatype sendtype,void *recvbuf,int recvcount,
              MPIABI_Datatype recvtype,MPIABI_Comm comm)

{
  int iVar1;
  
  iVar1 = MPI_Neighbor_allgather();
  return iVar1;
}

Assistant:

int MPIABI_Neighbor_allgather(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  int recvcount,
  MPIABI_Datatype recvtype,
  MPIABI_Comm comm
) {
  return MPI_Neighbor_allgather(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcount,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    (MPI_Comm)(WPI_Comm)comm
  );
}